

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

CallRef * __thiscall
wasm::Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,Type type,
          bool isReturn)

{
  CallRef *pCVar1;
  
  pCVar1 = MixedArena::alloc<wasm::CallRef>((MixedArena *)(this->wasm + 0x200));
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id = type.id;
  pCVar1->target = target;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pCVar1->operands,
             args);
  pCVar1->isReturn = isReturn;
  wasm::CallRef::finalize();
  return pCVar1;
}

Assistant:

CallRef* makeCallRef(Expression* target,
                       const T& args,
                       Type type,
                       bool isReturn = false) {
    auto* call = wasm.allocator.alloc<CallRef>();
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }